

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall monotonic_state::~monotonic_state(monotonic_state *this)

{
  undefined8 *in_RDI;
  float fVar1;
  int BUFFER_SIZE_THRESHOLD;
  float ratio;
  
  fVar1 = (float)*(int *)(in_RDI + 1) / (float)*(int *)((long)in_RDI + 0xc);
  if ((((*(byte *)(in_RDI + 6) & 1) != 0) && (in_RDI[5] != 0)) && (in_RDI[5] != in_RDI[4])) {
    printf("%s is monotonically increasing, max: %zu, max_step: %zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n"
           ,(double)fVar1,*in_RDI,in_RDI[5],in_RDI[4],(ulong)*(uint *)(in_RDI + 1),
           (ulong)*(uint *)((long)in_RDI + 0xc),*(undefined4 *)(in_RDI + 2));
  }
  if (0x14 < (ulong)in_RDI[5]) {
    printf("%s, unexpected large max buffering value, max: %zu, max_step: %zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n"
           ,(double)fVar1,*in_RDI,in_RDI[5],in_RDI[4],(ulong)*(uint *)(in_RDI + 1),
           (ulong)*(uint *)((long)in_RDI + 0xc),*(undefined4 *)(in_RDI + 2));
  }
  return;
}

Assistant:

~monotonic_state()
  {
    float ratio =
        static_cast<float>(source_rate) / static_cast<float>(target_rate);
    // Only report if there has been a meaningful increase in buffering. Do
    // not warn if the buffering was constant and small.
    if (monotonic && max_value && max_value != max_step) {
      printf("%s is monotonically increasing, max: %zu, max_step: %zu, "
             "in: %dHz, out: "
             "%dHz, block_size: %d, ratio: %lf\n",
             what, max_value, max_step, source_rate, target_rate, block_size,
             ratio);
    }
    // Arbitrary limit: if more than this number of frames has been buffered,
    // print a message.
    constexpr int BUFFER_SIZE_THRESHOLD = 20;
    if (max_value > BUFFER_SIZE_THRESHOLD) {
      printf("%s, unexpected large max buffering value, max: %zu, max_step: "
             "%zu, in: %dHz, out: %dHz, block_size: %d, ratio: %lf\n",
             what, max_value, max_step, source_rate, target_rate, block_size,
             ratio);
    }
  }